

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O0

void add_to_buried(obj *obj)

{
  obj *obj_local;
  
  if (obj->where != '\0') {
    panic("add_to_buried: obj not free (%d,%d,%d)",(ulong)(uint)(int)obj->where,
          (ulong)(uint)(int)obj->otyp,(ulong)(uint)(int)obj->invlet);
  }
  obj->where = '\x05';
  obj->nobj = obj->olev->buriedobjlist;
  obj->olev->buriedobjlist = obj;
  return;
}

Assistant:

void add_to_buried(struct obj *obj)
{
    if (obj->where != OBJ_FREE) {
	panic("add_to_buried: obj not free (%d,%d,%d)",
	      obj->where, obj->otyp, obj->invlet);
    }

    obj->where = OBJ_BURIED;
    obj->nobj = obj->olev->buriedobjlist;
    obj->olev->buriedobjlist = obj;
}